

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

compressed_scrollback_line * compressline(termline *ldata)

{
  size_t sVar1;
  bool bVar2;
  strbuf *buf_o;
  compressed_scrollback_line *pcVar3;
  wchar_t wVar4;
  uint uVar5;
  wchar_t wVar6;
  uint uVar7;
  BinarySink *bs;
  
  buf_o = strbuf_new();
  strbuf_append(buf_o,8);
  wVar4 = ldata->cols;
  if (L'\x7f' < wVar4) {
    wVar6 = wVar4;
    do {
      BinarySink_put_byte(buf_o->binarysink_,(byte)wVar6 | 0x80);
      wVar4 = (uint)wVar6 >> 7;
      bVar2 = 0x3fff < (uint)wVar6;
      wVar6 = wVar4;
    } while (bVar2);
  }
  bs = buf_o->binarysink_;
  BinarySink_put_byte(bs,(uchar)wVar4);
  uVar5 = (uint)CONCAT12(ldata->trusted,ldata->lattr);
  uVar7 = uVar5;
  if (0x7f < uVar5) {
    do {
      BinarySink_put_byte(bs,(byte)uVar5 | 0x80);
      uVar7 = uVar5 >> 7;
      bVar2 = 0x3fff < uVar5;
      uVar5 = uVar7;
    } while (bVar2);
  }
  BinarySink_put_byte(bs,(uchar)uVar7);
  makerle(buf_o,(termline *)(ulong)(uint)ldata->cols,
          (_func_void_strbuf_ptr_termchar_ptr_unsigned_long_ptr *)ldata->chars);
  makerle(buf_o,(termline *)(ulong)(uint)ldata->cols,
          (_func_void_strbuf_ptr_termchar_ptr_unsigned_long_ptr *)ldata->chars);
  makerle(buf_o,(termline *)(ulong)(uint)ldata->cols,
          (_func_void_strbuf_ptr_termchar_ptr_unsigned_long_ptr *)ldata->chars);
  makerle(buf_o,(termline *)(ulong)(uint)ldata->cols,
          (_func_void_strbuf_ptr_termchar_ptr_unsigned_long_ptr *)ldata->chars);
  sVar1 = buf_o->len;
  pcVar3 = (compressed_scrollback_line *)strbuf_to_str(buf_o);
  pcVar3->len = sVar1 - 8;
  return pcVar3;
}

Assistant:

static compressed_scrollback_line *compressline(termline *ldata)
{
    strbuf *b = strbuf_new();

    /* Leave space for the header structure */
    strbuf_append(b, sizeof(compressed_scrollback_line));

    /*
     * First, store the column count, 7 bits at a time, least
     * significant `digit' first, with the high bit set on all but
     * the last.
     */
    {
        int n = ldata->cols;
        while (n >= 128) {
            put_byte(b, (unsigned char)((n & 0x7F) | 0x80));
            n >>= 7;
        }
        put_byte(b, (unsigned char)(n));
    }

    /*
     * Next store the lattrs; same principle. We add one extra bit to
     * this to indicate the trust state of the line.
     */
    {
        int n = ldata->lattr | (ldata->trusted ? 0x10000 : 0);
        while (n >= 128) {
            put_byte(b, (unsigned char)((n & 0x7F) | 0x80));
            n >>= 7;
        }
        put_byte(b, (unsigned char)(n));
    }

    /*
     * Now we store a sequence of separate run-length encoded
     * fragments, each containing exactly as many symbols as there
     * are columns in the ldata.
     *
     * All of these have a common basic format:
     *
     *  - a byte 00-7F indicates that X+1 literals follow it
     *  - a byte 80-FF indicates that a single literal follows it
     *    and expects to be repeated (X-0x80)+2 times.
     *
     * The format of the `literals' varies between the fragments.
     */
    makerle(b, ldata, makeliteral_chr);
    makerle(b, ldata, makeliteral_attr);
    makerle(b, ldata, makeliteral_truecolour);
    makerle(b, ldata, makeliteral_cc);

    size_t linelen = b->len - sizeof(compressed_scrollback_line);
    compressed_scrollback_line *line =
        (compressed_scrollback_line *)strbuf_to_str(b);
    line->len = linelen;

    /*
     * Diagnostics: ensure that the compressed data really does
     * decompress to the right thing.
     *
     * This is a bit performance-heavy for production code.
     */
#ifdef TERM_CC_DIAGS
#ifndef CHECK_SB_COMPRESSION
    {
        termline *dcl;
        int i;

#ifdef DIAGNOSTIC_SB_COMPRESSION
        for (i = 0; i < b->len; i++) {
            printf(" %02x ", b->data[i]);
        }
        printf("\n");
#endif

        dcl = decompressline(line);
        assert(ldata->cols == dcl->cols);
        assert(ldata->lattr == dcl->lattr);
        for (i = 0; i < ldata->cols; i++)
            assert(termchars_equal(&ldata->chars[i], &dcl->chars[i]));

#ifdef DIAGNOSTIC_SB_COMPRESSION
        printf("%d cols (%d bytes) -> %d bytes (factor of %g)\n",
               ldata->cols, 4 * ldata->cols, dused,
               (double)dused / (4 * ldata->cols));
#endif

        freetermline(dcl);
    }
#endif
#endif /* TERM_CC_DIAGS */

    return line;
}